

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQGenerator::~SQGenerator(SQGenerator *this)

{
  SQCollectable_conflict *in_RDI;
  
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQGenerator_00154790;
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  }
  sqvector<SQExceptionTrap>::~sqvector((sqvector<SQExceptionTrap> *)in_RDI);
  SQVM::CallInfo::~CallInfo((CallInfo *)0x12a51d);
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  SQCollectable::~SQCollectable((SQCollectable *)0x12a543);
  return;
}

Assistant:

~SQGenerator()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
    }